

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

ActionResult __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckAction(ScriptValidator *this,Action *action)

{
  bool bVar1;
  ActionType AVar2;
  Result result_00;
  InvokeAction *action_00;
  GetAction *action_01;
  ActionResult AVar3;
  Action *action_local;
  ScriptValidator *this_local;
  ActionResult result;
  
  ZeroMemory<wabt::(anonymous_namespace)::ScriptValidator::ActionResult>
            ((ActionResult *)&this_local);
  AVar2 = Action::type(action);
  if (AVar2 == Invoke) {
    action_00 = cast<wabt::InvokeAction,wabt::Action>(action);
    result._0_8_ = CheckInvoke(this,action_00);
    this_local._0_4_ = (uint)((TypeVector *)result._0_8_ != (TypeVector *)0x0);
  }
  else if (AVar2 == Get) {
    action_01 = cast<wabt::GetAction,wabt::Action>(action);
    result_00 = CheckGet(this,action_01,(Type *)&result);
    bVar1 = Succeeded(result_00);
    if (bVar1) {
      this_local._0_4_ = 2;
    }
    else {
      this_local._0_4_ = 0;
    }
  }
  AVar3._4_4_ = 0;
  AVar3.kind = (uint)this_local;
  AVar3.field_1 = (anon_union_8_2_516a9242_for_ActionResult_2)result._0_8_;
  return AVar3;
}

Assistant:

ScriptValidator::ActionResult ScriptValidator::CheckAction(
    const Action* action) {
  ActionResult result;
  ZeroMemory(result);

  switch (action->type()) {
    case ActionType::Invoke:
      result.types = CheckInvoke(cast<InvokeAction>(action));
      result.kind =
          result.types ? ActionResult::Kind::Types : ActionResult::Kind::Error;
      break;

    case ActionType::Get:
      if (Succeeded(CheckGet(cast<GetAction>(action), &result.type))) {
        result.kind = ActionResult::Kind::Type;
      } else {
        result.kind = ActionResult::Kind::Error;
      }
      break;
  }

  return result;
}